

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlUTF8Charcmp(xmlChar *utf1,xmlChar *utf2)

{
  int len;
  xmlChar *utf2_local;
  xmlChar *utf1_local;
  
  if (utf1 == (xmlChar *)0x0) {
    if (utf2 == (xmlChar *)0x0) {
      utf1_local._4_4_ = 0;
    }
    else {
      utf1_local._4_4_ = -1;
    }
  }
  else {
    len = xmlUTF8Size(utf1);
    utf1_local._4_4_ = xmlStrncmp(utf1,utf2,len);
  }
  return utf1_local._4_4_;
}

Assistant:

int
xmlUTF8Charcmp(const xmlChar *utf1, const xmlChar *utf2) {

    if (utf1 == NULL ) {
        if (utf2 == NULL)
            return 0;
        return -1;
    }
    return xmlStrncmp(utf1, utf2, xmlUTF8Size(utf1));
}